

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  Slice SVar1;
  bool bVar2;
  reference ppWVar3;
  WriteBatch *pWVar4;
  long in_RCX;
  byte *in_RDX;
  long in_RSI;
  long lVar5;
  Writer *in_RDI;
  long in_FS_OFFSET;
  Writer *ready;
  bool sync_error;
  WriteBatch *write_batch;
  uint64_t last_sequence;
  Status *status;
  Writer *last_writer;
  MutexLock l;
  Writer w;
  VersionSet *in_stack_fffffffffffffe78;
  Status *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  Mutex *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  MemTable *memtable;
  undefined7 in_stack_fffffffffffffea8;
  Writer **in_stack_fffffffffffffeb0;
  DBImpl *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 uVar6;
  Writer *this_00;
  DBImpl *in_stack_ffffffffffffff10;
  value_type pWVar7;
  undefined1 local_90 [40];
  Writer *local_68;
  Writer local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = in_RSI + 200;
  this_00 = in_RDI;
  Writer::Writer((Writer *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
  local_58.sync = (bool)(*in_RDX & 1);
  local_58.done = false;
  MutexLock::MutexLock((MutexLock *)in_stack_fffffffffffffe78,(Mutex *)0x1891118);
  local_68 = &local_58;
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::push_back
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
             in_stack_fffffffffffffe78,(value_type *)0x1891146);
  while( true ) {
    uVar6 = false;
    if ((local_58.done & 1U) == 0) {
      ppWVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      uVar6 = &local_58 != *ppWVar3;
    }
    if ((bool)uVar6 == false) break;
    port::CondVar::Wait((CondVar *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  }
  if ((local_58.done & 1U) == 0) {
    MakeRoomForWrite(in_stack_ffffffffffffff10,SUB81((ulong)lVar5 >> 0x38,0));
    VersionSet::LastSequence(in_stack_fffffffffffffe78);
    local_90._32_8_ = &local_58;
    bVar2 = Status::ok((Status *)in_stack_fffffffffffffe78);
    SVar1.size_ = local_90._16_8_;
    SVar1.data_ = (char *)local_90._8_8_;
    if ((bVar2) && (local_90._8_16_ = (undefined1  [16])SVar1, in_RCX != 0)) {
      pWVar4 = BuildBatchGroup(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      WriteBatchInternal::SetSequence((WriteBatch *)in_stack_fffffffffffffe78,0x18912d8);
      WriteBatchInternal::Count((WriteBatch *)in_stack_fffffffffffffe78);
      port::Mutex::Unlock((Mutex *)in_stack_fffffffffffffe78);
      local_90._8_16_ =
           (undefined1  [16])
           WriteBatchInternal::Contents
                     ((WriteBatch *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      log::Writer::AddRecord(this_00,(Slice *)CONCAT17(uVar6,in_stack_fffffffffffffee8));
      memtable = (MemTable *)(local_90 + 0x18);
      Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                        in_stack_fffffffffffffe80);
      Status::~Status((Status *)in_stack_fffffffffffffe78);
      bVar2 = false;
      uVar6 = Status::ok((Status *)in_stack_fffffffffffffe78);
      if (((bool)uVar6) && ((*in_RDX & 1) != 0)) {
        (**(code **)(**(long **)(in_RSI + 0x148) + 0x28))(local_90);
        in_stack_fffffffffffffe90 = (Mutex *)local_90;
        Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                          in_stack_fffffffffffffe80);
        Status::~Status((Status *)in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe9f = Status::ok((Status *)in_stack_fffffffffffffe78);
        bVar2 = !(bool)in_stack_fffffffffffffe9f;
      }
      in_stack_fffffffffffffe8f = Status::ok((Status *)in_stack_fffffffffffffe78);
      if ((bool)in_stack_fffffffffffffe8f) {
        WriteBatchInternal::InsertInto
                  ((WriteBatch *)CONCAT17(uVar6,in_stack_fffffffffffffea8),memtable);
        Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                          in_stack_fffffffffffffe80);
        Status::~Status((Status *)in_stack_fffffffffffffe78);
      }
      port::Mutex::Lock((Mutex *)in_stack_fffffffffffffe78);
      if (bVar2) {
        RecordBackgroundError
                  ((DBImpl *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   in_stack_fffffffffffffe80);
      }
      if (pWVar4 == *(WriteBatch **)(in_RSI + 0x1b8)) {
        WriteBatch::Clear((WriteBatch *)in_stack_fffffffffffffe78);
      }
      VersionSet::SetLastSequence
                ((VersionSet *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                 (uint64_t)in_stack_fffffffffffffe80);
    }
    do {
      ppWVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      pWVar7 = *ppWVar3;
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                 in_stack_fffffffffffffe78);
      if (pWVar7 != &local_58) {
        Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                          (Status *)in_stack_fffffffffffffe90);
        pWVar7->done = true;
        port::CondVar::Signal((CondVar *)in_stack_fffffffffffffe78);
      }
    } while (pWVar7 != (value_type)local_90._32_8_);
    bVar2 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::empty
                      ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar2) {
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::front
                ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      port::CondVar::Signal((CondVar *)in_stack_fffffffffffffe78);
    }
  }
  else {
    Status::Status((Status *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   in_stack_fffffffffffffe80);
  }
  MutexLock::~MutexLock((MutexLock *)in_stack_fffffffffffffe78);
  Writer::~Writer((Writer *)in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(write_batch);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}